

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfutureinterface.cpp
# Opt level: O1

QFuture<void> QtFuture::makeReadyVoidFuture(void)

{
  QFutureInterfaceBasePrivate *extraout_RDX;
  QFutureInterfaceBase *in_RDI;
  long in_FS_OFFSET;
  QFuture<void> QVar1;
  QFutureInterfaceBase local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28._vptr_QFutureInterfaceBase = (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d = (QFutureInterfaceBasePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QFutureInterfaceBase::QFutureInterfaceBase(&local_28,NoState);
  local_28._vptr_QFutureInterfaceBase = (_func_int **)&PTR__QFutureInterfaceBase_006af7b8;
  QFutureInterfaceBase::reportStarted(&local_28);
  QFutureInterfaceBase::reportFinished(&local_28);
  QFutureInterfaceBase::runContinuation(&local_28);
  QFutureInterfaceBase::QFutureInterfaceBase(in_RDI,&local_28);
  QFutureInterfaceBase::~QFutureInterfaceBase(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    QVar1.d.d = extraout_RDX;
    QVar1.d._vptr_QFutureInterfaceBase = (_func_int **)in_RDI;
    return (QFuture<void>)QVar1.d;
  }
  __stack_chk_fail();
}

Assistant:

QFuture<void> makeReadyVoidFuture()
{
    QFutureInterface<void> promise;
    promise.reportStarted();
    promise.reportFinished();

    return promise.future();
}